

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

uint gpu::calcNChunk(size_t n,size_t group_size,size_t max_size)

{
  ulong uVar1;
  
  if (n != 0) {
    uVar1 = ((n + max_size) - 1) / max_size;
    uVar1 = (group_size + ((uVar1 + n) - 1) / uVar1) - 1;
    group_size = uVar1 - uVar1 % group_size;
  }
  return (uint)group_size;
}

Assistant:

unsigned int gpu::calcNChunk(size_t n, size_t group_size, size_t max_size)
{
	if (n == 0)
		return group_size;

	size_t work_parts_n = (n + max_size - 1) / max_size;
	size_t exec_n = (n + work_parts_n - 1) / work_parts_n;
	exec_n = (exec_n + group_size - 1) / group_size * group_size;
	return (unsigned int) exec_n;
}